

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  void *pvVar5;
  float *pfVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [32];
  int iVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [28];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  
  iVar17 = bottom_top_blob->elempack;
  iVar15 = bottom_top_blob->dims;
  iVar14 = bottom_top_blob->w;
  uVar4 = bottom_top_blob->h;
  if (iVar15 == 3) {
    iVar15 = iVar14 * iVar17 * uVar4;
    uVar18 = 0;
    uVar4 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = 0;
    }
    for (; uVar18 != uVar4; uVar18 = uVar18 + 1) {
      pfVar6 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar24 = *pfVar6;
        auVar26._4_4_ = fVar24;
        auVar26._0_4_ = fVar24;
        auVar26._8_4_ = fVar24;
        auVar26._12_4_ = fVar24;
LAB_002f94db:
        auVar29._16_16_ = auVar26;
        auVar29._0_16_ = auVar26;
        auVar27 = auVar29._0_28_;
      }
      else {
        fVar24 = pfVar6[uVar18];
        if (iVar17 == 4) {
          auVar26 = *(undefined1 (*) [16])(pfVar6 + uVar18 * 4);
          goto LAB_002f94db;
        }
        auVar26 = vshufps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),0);
        if (iVar17 != 8) goto LAB_002f94db;
        auVar27 = SUB3228(*(undefined1 (*) [32])(pfVar6 + uVar18 * 8),0);
      }
      pvVar5 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->elemsize;
      sVar8 = bottom_top_blob->cstep;
      pauVar21 = (undefined1 (*) [32])(sVar8 * uVar18 * sVar7 + (long)pvVar5);
      lVar16 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar15; iVar14 = iVar14 + 8) {
        auVar29 = vmaxps_avx(*pauVar21,ZEXT1232(ZEXT812(0)));
        auVar28 = vminps_avx(*pauVar21,ZEXT1232(ZEXT812(0)));
        auVar31._0_4_ = auVar28._0_4_ * auVar27._0_4_ + auVar29._0_4_;
        auVar31._4_4_ = auVar28._4_4_ * auVar27._4_4_ + auVar29._4_4_;
        auVar31._8_4_ = auVar28._8_4_ * auVar27._8_4_ + auVar29._8_4_;
        auVar31._12_4_ = auVar28._12_4_ * auVar27._12_4_ + auVar29._12_4_;
        auVar31._16_4_ = auVar28._16_4_ * auVar27._16_4_ + auVar29._16_4_;
        auVar31._20_4_ = auVar28._20_4_ * auVar27._20_4_ + auVar29._20_4_;
        auVar31._24_4_ = auVar28._24_4_ * auVar27._24_4_ + auVar29._24_4_;
        auVar31._28_4_ = auVar28._28_4_ + auVar29._28_4_;
        *pauVar21 = auVar31;
        pauVar21 = pauVar21 + 1;
        lVar16 = lVar16 + 8;
      }
      for (; iVar14 + 3 < iVar15; iVar14 = iVar14 + 4) {
        auVar25 = vmaxps_avx(*(undefined1 (*) [16])*pauVar21,ZEXT816(0));
        auVar23 = vminps_avx(*(undefined1 (*) [16])*pauVar21,ZEXT816(0));
        *(float *)*pauVar21 = auVar23._0_4_ * auVar26._0_4_ + auVar25._0_4_;
        *(float *)(*pauVar21 + 4) = auVar23._4_4_ * auVar26._4_4_ + auVar25._4_4_;
        *(float *)(*pauVar21 + 8) = auVar23._8_4_ * auVar26._8_4_ + auVar25._8_4_;
        *(float *)(*pauVar21 + 0xc) = auVar23._12_4_ * auVar26._12_4_ + auVar25._12_4_;
        pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
        lVar16 = lVar16 + 4;
      }
      lVar19 = sVar8 * sVar7 * uVar18;
      for (; (int)lVar16 < iVar15; lVar16 = lVar16 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar16 * 4 + lVar19);
        if (fVar3 < 0.0) {
          *(float *)((long)pvVar5 + lVar16 * 4 + lVar19) = fVar3 * fVar24;
        }
      }
    }
  }
  else if (iVar15 == 2) {
    iVar14 = iVar14 * iVar17;
    uVar20 = 0;
    uVar18 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar18 = uVar20;
    }
    for (; uVar20 != uVar18; uVar20 = uVar20 + 1) {
      pfVar6 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar24 = *pfVar6;
        auVar25._4_4_ = fVar24;
        auVar25._0_4_ = fVar24;
        auVar25._8_4_ = fVar24;
        auVar25._12_4_ = fVar24;
LAB_002f93a6:
        auVar28._16_16_ = auVar25;
        auVar28._0_16_ = auVar25;
        auVar27 = auVar28._0_28_;
      }
      else {
        fVar24 = pfVar6[uVar20];
        if (iVar17 == 4) {
          auVar25 = *(undefined1 (*) [16])(pfVar6 + uVar20 * 4);
          goto LAB_002f93a6;
        }
        auVar25 = vshufps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),0);
        if (iVar17 != 8) goto LAB_002f93a6;
        auVar27 = SUB3228(*(undefined1 (*) [32])(pfVar6 + uVar20 * 8),0);
      }
      pvVar5 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->elemsize;
      iVar15 = bottom_top_blob->w;
      pauVar21 = (undefined1 (*) [32])(uVar20 * (long)iVar15 * sVar7 + (long)pvVar5);
      lVar16 = 0;
      for (iVar22 = 0; iVar22 + 7 < iVar14; iVar22 = iVar22 + 8) {
        auVar29 = vmaxps_avx(*pauVar21,ZEXT832(0));
        auVar28 = vminps_avx(*pauVar21,ZEXT832(0));
        auVar30._0_4_ = auVar28._0_4_ * auVar27._0_4_ + auVar29._0_4_;
        auVar30._4_4_ = auVar28._4_4_ * auVar27._4_4_ + auVar29._4_4_;
        auVar30._8_4_ = auVar28._8_4_ * auVar27._8_4_ + auVar29._8_4_;
        auVar30._12_4_ = auVar28._12_4_ * auVar27._12_4_ + auVar29._12_4_;
        auVar30._16_4_ = auVar28._16_4_ * auVar27._16_4_ + auVar29._16_4_;
        auVar30._20_4_ = auVar28._20_4_ * auVar27._20_4_ + auVar29._20_4_;
        auVar30._24_4_ = auVar28._24_4_ * auVar27._24_4_ + auVar29._24_4_;
        auVar30._28_4_ = auVar28._28_4_ + auVar29._28_4_;
        *pauVar21 = auVar30;
        pauVar21 = pauVar21 + 1;
        lVar16 = lVar16 + 8;
      }
      for (; iVar22 + 3 < iVar14; iVar22 = iVar22 + 4) {
        auVar26 = vmaxps_avx(*(undefined1 (*) [16])*pauVar21,ZEXT816(0));
        auVar23 = vminps_avx(*(undefined1 (*) [16])*pauVar21,ZEXT816(0));
        *(float *)*pauVar21 = auVar23._0_4_ * auVar25._0_4_ + auVar26._0_4_;
        *(float *)(*pauVar21 + 4) = auVar23._4_4_ * auVar25._4_4_ + auVar26._4_4_;
        *(float *)(*pauVar21 + 8) = auVar23._8_4_ * auVar25._8_4_ + auVar26._8_4_;
        *(float *)(*pauVar21 + 0xc) = auVar23._12_4_ * auVar25._12_4_ + auVar26._12_4_;
        pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
        lVar16 = lVar16 + 4;
      }
      lVar19 = sVar7 * uVar20 * (long)iVar15;
      for (; (int)lVar16 < iVar14; lVar16 = lVar16 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar16 * 4 + lVar19);
        if (fVar3 < 0.0) {
          *(float *)((long)pvVar5 + lVar16 * 4 + lVar19) = fVar3 * fVar24;
        }
      }
    }
  }
  else if (iVar15 == 1) {
    iVar17 = iVar17 * iVar14;
    pvVar5 = bottom_top_blob->data;
    pfVar6 = (float *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      fVar24 = *pfVar6;
      auVar23._4_4_ = fVar24;
      auVar23._0_4_ = fVar24;
      auVar23._8_4_ = fVar24;
      auVar23._12_4_ = fVar24;
      iVar15 = (int)((long)iVar17 / 8);
      lVar16 = 0;
      uVar18 = 0;
      if (0 < iVar15) {
        uVar18 = (long)iVar17 / 8 & 0xffffffff;
      }
      for (; uVar18 * 0x20 != lVar16; lVar16 = lVar16 + 0x20) {
        auVar29 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar16),ZEXT832(0));
        auVar28 = vminps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar16),ZEXT832(0));
        pfVar6 = (float *)((long)pvVar5 + lVar16);
        *pfVar6 = auVar28._0_4_ * fVar24 + auVar29._0_4_;
        pfVar6[1] = auVar28._4_4_ * fVar24 + auVar29._4_4_;
        pfVar6[2] = auVar28._8_4_ * fVar24 + auVar29._8_4_;
        pfVar6[3] = auVar28._12_4_ * fVar24 + auVar29._12_4_;
        pfVar6[4] = auVar28._16_4_ * fVar24 + auVar29._16_4_;
        pfVar6[5] = auVar28._20_4_ * fVar24 + auVar29._20_4_;
        pfVar6[6] = auVar28._24_4_ * fVar24 + auVar29._24_4_;
        pfVar6[7] = auVar28._28_4_ + auVar29._28_4_;
      }
      iVar14 = iVar15 * 8;
      uVar18 = (long)(iVar17 + iVar15 * -8) / 4;
      iVar15 = (int)uVar18;
      auVar26 = vshufps_avx(auVar23,auVar23,0);
      lVar16 = 0;
      uVar20 = 0;
      if (0 < iVar15) {
        uVar20 = uVar18 & 0xffffffff;
      }
      while( true ) {
        if (uVar20 * 0x10 == lVar16) break;
        auVar25 = *(undefined1 (*) [16])((long)pvVar5 + lVar16 + (long)iVar14 * 4);
        auVar23 = vmaxps_avx(auVar25,ZEXT816(0) << 0x40);
        auVar25 = vminps_avx(auVar25,ZEXT816(0) << 0x40);
        pfVar6 = (float *)((long)pvVar5 + lVar16 + (long)iVar14 * 4);
        *pfVar6 = auVar25._0_4_ * auVar26._0_4_ + auVar23._0_4_;
        pfVar6[1] = auVar25._4_4_ * auVar26._4_4_ + auVar23._4_4_;
        pfVar6[2] = auVar25._8_4_ * auVar26._8_4_ + auVar23._8_4_;
        pfVar6[3] = auVar25._12_4_ * auVar26._12_4_ + auVar23._12_4_;
        lVar16 = lVar16 + 0x10;
      }
      for (lVar16 = (long)(iVar14 + iVar15 * 4); lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar3 = *(float *)((long)pvVar5 + lVar16 * 4);
        if (fVar3 < 0.0) {
          *(float *)((long)pvVar5 + lVar16 * 4) = fVar3 * fVar24;
        }
      }
    }
    else {
      iVar15 = (int)((long)iVar17 / 8);
      lVar16 = 0;
      uVar18 = 0;
      if (0 < iVar15) {
        uVar18 = (long)iVar17 / 8 & 0xffffffff;
      }
      for (; uVar18 * 0x20 != lVar16; lVar16 = lVar16 + 0x20) {
        auVar28 = vminps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar16),ZEXT1232(ZEXT812(0)));
        pfVar1 = (float *)((long)pfVar6 + lVar16);
        fVar24 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar10 = pfVar1[3];
        fVar11 = pfVar1[4];
        fVar12 = pfVar1[5];
        fVar13 = pfVar1[6];
        auVar29 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar16),ZEXT1232(ZEXT812(0)));
        pfVar2 = (float *)((long)pvVar5 + lVar16);
        *pfVar2 = auVar28._0_4_ * *pfVar1 + auVar29._0_4_;
        pfVar2[1] = auVar28._4_4_ * fVar24 + auVar29._4_4_;
        pfVar2[2] = auVar28._8_4_ * fVar3 + auVar29._8_4_;
        pfVar2[3] = auVar28._12_4_ * fVar10 + auVar29._12_4_;
        pfVar2[4] = auVar28._16_4_ * fVar11 + auVar29._16_4_;
        pfVar2[5] = auVar28._20_4_ * fVar12 + auVar29._20_4_;
        pfVar2[6] = auVar28._24_4_ * fVar13 + auVar29._24_4_;
        pfVar2[7] = auVar28._28_4_ + auVar29._28_4_;
      }
      uVar18 = (long)(iVar17 + iVar15 * -8) / 4;
      iVar14 = (int)uVar18;
      lVar19 = (long)(iVar15 * 8);
      lVar16 = 0;
      uVar20 = 0;
      if (0 < iVar14) {
        uVar20 = uVar18 & 0xffffffff;
      }
      for (; uVar20 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
        auVar26 = *(undefined1 (*) [16])((long)pvVar5 + lVar16 + lVar19 * 4);
        auVar25 = vminps_avx(auVar26,ZEXT416(0) << 0x20);
        pfVar1 = (float *)((long)pfVar6 + lVar16 + lVar19 * 4);
        fVar24 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar10 = pfVar1[3];
        auVar26 = vmaxps_avx(auVar26,ZEXT416(0) << 0x20);
        pfVar2 = (float *)((long)pvVar5 + lVar16 + lVar19 * 4);
        *pfVar2 = auVar25._0_4_ * *pfVar1 + auVar26._0_4_;
        pfVar2[1] = auVar25._4_4_ * fVar24 + auVar26._4_4_;
        pfVar2[2] = auVar25._8_4_ * fVar3 + auVar26._8_4_;
        pfVar2[3] = auVar25._12_4_ * fVar10 + auVar26._12_4_;
      }
      pvVar9 = (this->super_PReLU).slope_data.data;
      for (lVar16 = (long)(iVar15 * 8 + iVar14 * 4); lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar24 = *(float *)((long)pvVar5 + lVar16 * 4);
        if (fVar24 < 0.0) {
          *(float *)((long)pvVar5 + lVar16 * 4) = fVar24 * *(float *)((long)pvVar9 + lVar16 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}